

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void load256i128(uint16_t *out,secp256k1_int128 *v)

{
  undefined8 uVar1;
  uint64_t lo_00;
  uint64_t hi_00;
  undefined8 *in_RSI;
  uint16_t *in_RDI;
  secp256k1_int128 c;
  int64_t hi;
  uint64_t lo;
  secp256k1_int128 *r;
  
  uVar1 = *in_RSI;
  r = (secp256k1_int128 *)in_RSI[1];
  lo_00 = secp256k1_i128_to_u64((secp256k1_int128 *)&stack0xffffffffffffffc8);
  secp256k1_i128_rshift(r,(uint)((ulong)uVar1 >> 0x20));
  hi_00 = secp256k1_i128_to_i64(r);
  load256two64(in_RDI,hi_00,lo_00,1);
  return;
}

Assistant:

static void load256i128(uint16_t* out, const secp256k1_int128* v) {
    uint64_t lo;
    int64_t hi;
    secp256k1_int128 c = *v;
    lo = secp256k1_i128_to_u64(&c);
    secp256k1_i128_rshift(&c, 64);
    hi = secp256k1_i128_to_i64(&c);
    load256two64(out, hi, lo, 1);
}